

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_part_cell_node(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_INT *cell_node)

{
  uint uVar1;
  REF_STATUS RVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  *cell_node = -1;
  RVar2 = 3;
  if ((-1 < cell) && (cell <= ref_cell->max)) {
    lVar6 = (long)cell * (long)ref_cell->size_per;
    uVar1 = ref_cell->c2n[lVar6];
    RVar2 = 3;
    if ((ulong)uVar1 != 0xffffffff) {
      lVar3 = -1;
      if ((-1 < (int)uVar1) && ((int)uVar1 < ref_node->max)) {
        lVar3 = -1;
        if (-1 < ref_node->global[uVar1]) {
          lVar3 = ref_node->global[uVar1];
        }
      }
      iVar4 = 0;
      if (1 < (long)ref_cell->node_per) {
        uVar5 = 0;
        uVar7 = 1;
        do {
          iVar4 = ref_cell->c2n[(long)(int)lVar6 + uVar7];
          lVar8 = -1;
          if (((-1 < (long)iVar4) && (iVar4 < ref_node->max)) &&
             (lVar8 = ref_node->global[iVar4], lVar8 < 0)) {
            lVar8 = -1;
          }
          if (lVar8 < lVar3) {
            uVar5 = uVar7 & 0xffffffff;
            lVar3 = lVar8;
          }
          iVar4 = (int)uVar5;
          uVar7 = uVar7 + 1;
        } while ((long)ref_cell->node_per != uVar7);
      }
      if (iVar4 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x38a,"ref_cell_part_cell_node","node is empty?");
        RVar2 = 1;
      }
      else {
        *cell_node = iVar4;
        RVar2 = 0;
      }
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_part_cell_node(REF_CELL ref_cell, REF_NODE ref_node,
                                           REF_INT cell, REF_INT *cell_node) {
  REF_GLOB global, smallest_global;
  REF_INT node, smallest_global_node;
  *cell_node = REF_EMPTY;
  if (cell < 0 || cell > ref_cell_max(ref_cell)) return REF_INVALID;
  if (REF_EMPTY == ref_cell_c2n(ref_cell, 0, cell)) return REF_INVALID;
  /* set first node as smallest */
  node = 0;
  global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
  smallest_global = global;
  smallest_global_node = node;
  /* search other nodes for smaller global */
  for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
    global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
    if (global < smallest_global) {
      smallest_global = global;
      smallest_global_node = node;
    }
  }
  RUS(REF_EMPTY, smallest_global_node, "node is empty?");
  *cell_node = smallest_global_node;
  return REF_SUCCESS;
}